

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseLifLayer.cpp
# Opt level: O0

ILayer * __thiscall
DenseLifLayer::Backward(DenseLifLayer *this,vector<float,_std::allocator<float>_> *deltas)

{
  INeuron *this_00;
  bool bVar1;
  int iVar2;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *this_01;
  reference ppIVar3;
  size_type sVar4;
  size_t sVar5;
  reference ppIVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined1 auVar7 [16];
  int local_54;
  float delta;
  int idx;
  INeuron *neuron;
  iterator __end1;
  iterator __begin1;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *__range1;
  long lStack_28;
  float meanReversedSquaredThresholds;
  size_t activeNeurons;
  float totalLayerOutput;
  vector<float,_std::allocator<float>_> *deltas_local;
  DenseLifLayer *this_local;
  
  activeNeurons._4_4_ = 0.0;
  lStack_28 = 0;
  __range1._4_4_ = 0.0;
  this_01 = &(this->super_ILayer).neurons;
  __end1 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::begin(this_01);
  neuron = (INeuron *)std::vector<INeuron_*,_std::allocator<INeuron_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>
                                *)&neuron);
    if (!bVar1) break;
    ppIVar3 = __gnu_cxx::
              __normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>::
              operator*(&__end1);
    this_00 = *ppIVar3;
    (*this_00->_vptr_INeuron[4])();
    activeNeurons._4_4_ = extraout_XMM0_Da + activeNeurons._4_4_;
    iVar2 = INeuron::GetOutputSpikeCounter(this_00);
    lStack_28 = (ulong)(0 < iVar2) + lStack_28;
    (*this_00->_vptr_INeuron[0xb])();
    (*this_00->_vptr_INeuron[0xb])();
    __range1._4_4_ = __range1._4_4_ + (1.0 / extraout_XMM0_Da_00) / extraout_XMM0_Da_01;
    __gnu_cxx::__normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>::
    operator++(&__end1);
  }
  sVar4 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::size(&(this->super_ILayer).neurons);
  auVar7._8_4_ = (int)(sVar4 >> 0x20);
  auVar7._0_8_ = sVar4;
  auVar7._12_4_ = 0x45300000;
  sqrt((double)__range1._4_4_ /
       ((auVar7._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  local_54 = 0;
  while( true ) {
    sVar5 = ILayer::GetSize(&this->super_ILayer);
    if (sVar5 <= (ulong)(long)local_54) break;
    bVar1 = std::vector<float,_std::allocator<float>_>::empty(deltas);
    if (!bVar1) {
      std::vector<float,_std::allocator<float>_>::operator[](deltas,(long)local_54);
    }
    ppIVar6 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::operator[]
                        (&(this->super_ILayer).neurons,(long)local_54);
    (*(*ppIVar6)->_vptr_INeuron[7])
              ((ulong)(uint)activeNeurons._4_4_,*ppIVar6,(this->super_ILayer).meta.size,lStack_28);
    local_54 = local_54 + 1;
  }
  return &this->super_ILayer;
}

Assistant:

ILayer &DenseLifLayer::Backward( const std::vector<float> &deltas )
{
    float totalLayerOutput = 0;
    size_t activeNeurons = 0;
    float meanReversedSquaredThresholds = 0;
    for ( auto neuron: neurons ) {
        totalLayerOutput += neuron->GetOutput();
        activeNeurons += neuron->GetOutputSpikeCounter() > 0;
        meanReversedSquaredThresholds += 1. / neuron->GetMaxMP() / neuron->GetMaxMP();
    }
    meanReversedSquaredThresholds = sqrt( 1. * meanReversedSquaredThresholds / neurons.size() );

    for ( int idx = 0; idx < GetSize(); ++idx ) {
        float delta = 0;
        if ( !deltas.empty()) {
            delta = deltas[idx];
        }
        neurons[idx]->Backward( totalLayerOutput, delta, meta.size, activeNeurons, meanReversedSquaredThresholds );
    }
    return *this;
}